

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::subnet_test::test_method(subnet_test *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  bool bVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  CNetAddr *pCVar6;
  undefined ***pppuVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string file_79;
  const_string file_80;
  const_string file_81;
  const_string file_82;
  const_string file_83;
  const_string file_84;
  const_string file_85;
  const_string file_86;
  const_string file_87;
  const_string file_88;
  const_string file_89;
  const_string file_90;
  const_string file_91;
  const_string file_92;
  const_string file_93;
  const_string file_94;
  const_string file_95;
  const_string file_96;
  const_string file_97;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  const_string msg_79;
  const_string msg_80;
  const_string msg_81;
  const_string msg_82;
  const_string msg_83;
  const_string msg_84;
  const_string msg_85;
  const_string msg_86;
  const_string msg_87;
  const_string msg_88;
  const_string msg_89;
  const_string msg_90;
  const_string msg_91;
  const_string msg_92;
  const_string msg_93;
  const_string msg_94;
  const_string msg_95;
  const_string msg_96;
  const_string msg_97;
  check_type cVar9;
  char *pcVar8;
  string *__return_storage_ptr__;
  char *local_1410;
  char *local_1408;
  undefined1 *local_1400;
  undefined1 *local_13f8;
  char *local_13f0;
  char *local_13e8;
  char *local_13e0;
  char *local_13d8;
  undefined1 *local_13d0;
  undefined1 *local_13c8;
  char *local_13c0;
  char *local_13b8;
  char *local_13b0;
  char *local_13a8;
  undefined1 *local_13a0;
  undefined1 *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  undefined1 *local_1370;
  undefined1 *local_1368;
  char *local_1360;
  char *local_1358;
  char *local_1350;
  char *local_1348;
  undefined1 *local_1340;
  undefined1 *local_1338;
  char *local_1330;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  undefined1 *local_1310;
  undefined1 *local_1308;
  char *local_1300;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  undefined1 *local_12e0;
  undefined1 *local_12d8;
  char *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char *local_12b8;
  undefined1 *local_12b0;
  undefined1 *local_12a8;
  char *local_12a0;
  char *local_1298;
  char *local_1290;
  char *local_1288;
  undefined1 *local_1280;
  undefined1 *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1258;
  undefined1 *local_1250;
  undefined1 *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  char *local_1200;
  char *local_11f8;
  undefined1 *local_11f0;
  undefined1 *local_11e8;
  char *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  undefined1 *local_11c0;
  undefined1 *local_11b8;
  char *local_11b0;
  char *local_11a8;
  char *local_11a0;
  char *local_1198;
  undefined1 *local_1190;
  undefined1 *local_1188;
  char *local_1180;
  char *local_1178;
  char *local_1170;
  char *local_1168;
  undefined1 *local_1160;
  undefined1 *local_1158;
  char *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  char *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  char *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  undefined1 *local_1070;
  undefined1 *local_1068;
  char *local_1060;
  char *local_1058;
  char *local_1050;
  char *local_1048;
  undefined1 *local_1040;
  undefined1 *local_1038;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  undefined1 *local_1010;
  undefined1 *local_1008;
  char *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  undefined1 *local_fe0;
  undefined1 *local_fd8;
  char *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  undefined1 *local_fb0;
  undefined1 *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  undefined1 *local_f80;
  undefined1 *local_f78;
  char *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f58;
  undefined1 *local_f50;
  undefined1 *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  undefined1 *local_ec0;
  undefined1 *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  char *local_e98;
  undefined1 *local_e90;
  undefined1 *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  undefined1 *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  undefined1 *local_d10;
  undefined1 *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  assertion_result local_a90;
  allocator<char> *local_a78;
  allocator<char> local_a69;
  assertion_result local_a68;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  allocator<char> local_869;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_118;
  direct_or_indirect local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  direct_or_indirect local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  undefined1 local_c8 [56];
  CNetAddr tor_addr;
  CSubNet subnet;
  
  local_1030 = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9a;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"1.2.3.0/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.0/255.255.255.0",(allocator<char> *)&local_aa0);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)::operator==(&subnet,(CSubNet *)local_c8);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.3.0/24\") == LookupSubNet(\"1.2.3.0/255.255.255.0\")";
  local_a90.m_message.px = (element_type *)0xbc7d88;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_150 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  local_128[0] = rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_158,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9b;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"1.2.3.0/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.4.0/255.255.255.0",(allocator<char> *)&local_aa0);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  local_128[0] = (class_property<bool>)::operator!=(&subnet,(CSubNet *)local_c8);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.3.0/24\") != LookupSubNet(\"1.2.4.0/255.255.255.0\")";
  local_a90.m_message.px = (element_type *)0xbc7de2;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_180 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_188,0x9b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x9c;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.3.0/24\").Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc7e19;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_1b8,0x9c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.2.0/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"1.2.2.0/24\").Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc7e5c;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_1e8,0x9d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9e;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.4",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.3.4\").Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc7e90;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_210 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_218,0x9e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9f;
  file_04.m_begin = (iterator)&local_228;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.4/32",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.3.4/32\").Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc7ec7;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_240 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_248,0x9f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa0;
  file_05.m_begin = (iterator)&local_258;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.4",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"5.6.7.8",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"1.2.3.4\").Match(ResolveIP(\"5.6.7.8\"))";
  local_a90.m_message.px = (element_type *)0xbc7f04;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_270 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_278,0xa0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa1;
  file_06.m_begin = (iterator)&local_288;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.4/32",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"5.6.7.8",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"1.2.3.4/32\").Match(ResolveIP(\"5.6.7.8\"))";
  local_a90.m_message.px = (element_type *)0xbc7f3c;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_2a8,0xa1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa2;
  file_07.m_begin = (iterator)&local_2b8;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"::ffff:127.0.0.1",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"127.0.0.1",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"::ffff:127.0.0.1\").Match(ResolveIP(\"127.0.0.1\"))";
  local_a90.m_message.px = (element_type *)0xbc7f7b;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_2d8,0xa2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xa3;
  file_08.m_begin = (iterator)&local_2e8;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1:2:3:4:5:6:7:8\").Match(ResolveIP(\"1:2:3:4:5:6:7:8\"))";
  local_a90.m_message.px = (element_type *)0xbc7fcf;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_300 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_308,0xa3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xa4;
  file_09.m_begin = (iterator)&local_318;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:9",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"1:2:3:4:5:6:7:8\").Match(ResolveIP(\"1:2:3:4:5:6:7:9\"))";
  local_a90.m_message.px = (element_type *)0xbc8024;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_330 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_338,0xa4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa5;
  file_10.m_begin = (iterator)&local_348;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:0/112",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:1234",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1:2:3:4:5:6:7:0/112\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))"
  ;
  local_a90.m_message.px = (element_type *)0xbc8096;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_360 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_368,0xa5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa6;
  file_11.m_begin = (iterator)&local_378;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"192.168.0.1/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"192.168.0.2",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"192.168.0.1/24\").Match(ResolveIP(\"192.168.0.2\"))";
  local_a90.m_message.px = (element_type *)0xbc80f0;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_390 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_398,0xa6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xa7;
  file_12.m_begin = (iterator)&local_3a8;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8,
             msg_12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"192.168.0.20/29",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"192.168.0.18",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"192.168.0.20/29\").Match(ResolveIP(\"192.168.0.18\"))";
  local_a90.m_message.px = (element_type *)0xbc814e;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3c0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_3c8,0xa7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xa8;
  file_13.m_begin = (iterator)&local_3d8;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e8,
             msg_13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.2.1/24",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.2.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.2.1/24\").Match(ResolveIP(\"1.2.2.4\"))";
  local_a90.m_message.px = (element_type *)0xbc8198;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3f0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_3f8,0xa8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xa9;
  file_14.m_begin = (iterator)&local_408;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_418,
             msg_14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.2.110/31",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.2.111",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.2.110/31\").Match(ResolveIP(\"1.2.2.111\"))";
  local_a90.m_message.px = (element_type *)0xbc81ea;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_420 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_428,0xa9);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xaa;
  file_15.m_begin = (iterator)&local_438;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_448,
             msg_15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.2.20/26",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.2.63",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"1.2.2.20/26\").Match(ResolveIP(\"1.2.2.63\"))";
  local_a90.m_message.px = (element_type *)0xbc8238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_450 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_458,0xaa);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xac;
  file_16.m_begin = (iterator)&local_468;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_478,
             msg_16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"::/0",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:1234",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  local_128[0] = (class_property<bool>)CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "LookupSubNet(\"::/0\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))";
  local_a90.m_message.px = (element_type *)0xbc8279;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_480 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_488,0xac);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xae;
  file_17.m_begin = (iterator)&local_498;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4a8,
             msg_17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"::/0",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"::",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"::\"))";
  local_a90.m_message.px = (element_type *)0xbc82a6;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_4b8,0xae);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xaf;
  file_18.m_begin = (iterator)&local_4c8;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4d8,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"::/0",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"0.0.0.0",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"0.0.0.0\"))";
  local_a90.m_message.px = (element_type *)0xbc82d8;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_4e8,0xaf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb1;
  file_19.m_begin = (iterator)&local_4f8;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_508,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"::/0",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc830a;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_510 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_518,0xb1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xb3;
  file_20.m_begin = (iterator)&local_528;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_538,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"0.0.0.0/0",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:1234",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"0.0.0.0/0\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))";
  local_a90.m_message.px = (element_type *)0xbc8356;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_540 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_548,0xb3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xb5;
  file_21.m_begin = (iterator)&local_558;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_568,
             msg_21);
  CSubNet::CSubNet(&subnet);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"1.2.3.4",(allocator<char> *)&local_a90);
  ResolveIP((CNetAddr *)local_c8,(string *)&tor_addr);
  bVar3 = CSubNet::Match(&subnet,(CNetAddr *)local_c8);
  local_108.direct[0] = !bVar3;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_128._0_8_ = "!CSubNet().Match(ResolveIP(\"1.2.3.4\"))";
  local_128._8_8_ = "";
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
  local_e8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_570 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_d8._8_8_ = (assertion_result *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_108,(lazy_ostream *)&local_e8,1,0,WARN,_cVar9,
             (size_t)&local_578,0xb5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&tor_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xb6;
  file_22.m_begin = (iterator)&local_588;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_598,
             msg_22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"4.5.6.7",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"\").Match(ResolveIP(\"4.5.6.7\"))";
  local_a90.m_message.px = (element_type *)0xbc83b3;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (allocator<char> *)&local_a90;
  local_128[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_5a8,0xb6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xb7;
  file_23.m_begin = (iterator)&local_5b8;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5c8,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"bloop",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"0.0.0.0",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"bloop\").Match(ResolveIP(\"0.0.0.0\"))";
  local_a90.m_message.px = (element_type *)0xbc83ec;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (allocator<char> *)&local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_5d8,0xb7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0xb8;
  file_24.m_begin = (iterator)&local_5e8;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5f8,
             msg_24);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"bloop",(allocator<char> *)&local_a68);
  LookupSubNet(&subnet,(string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"hab",(allocator<char> *)&local_aa0);
  ResolveIP(&tor_addr,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,&tor_addr);
  local_128[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!LookupSubNet(\"bloop\").Match(ResolveIP(\"hab\"))";
  local_a90.m_message.px = (element_type *)0xbc841f;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_600 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (allocator<char> *)&local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_608,0xb8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0xba;
  file_25.m_begin = (iterator)&local_618;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_628,
             msg_25);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/0",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  rVar2.super_class_property<bool>.value = (class_property<bool>)CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "LookupSubNet(\"1.2.3.0/0\").IsValid()";
  local_108._8_8_ = (long)"LookupSubNet(\"1.2.3.0/0\").IsValid()" + 0x23;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_630 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  local_e8.direct[0] = (char)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_638,0xba);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xbb;
  file_26.m_begin = (iterator)&local_648;
  msg_26.m_end = pvVar5;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_658,
             msg_26);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/-1",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/-1\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/-1\").IsValid()" + 0x25;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_660 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_668,0xbb);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xbc;
  file_27.m_begin = (iterator)&local_678;
  msg_27.m_end = pvVar5;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_688,
             msg_27);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/32",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  local_e8.direct[0] = CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "LookupSubNet(\"1.2.3.0/32\").IsValid()";
  local_108._8_8_ = (long)"LookupSubNet(\"1.2.3.0/32\").IsValid()" + 0x24;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_690 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_698,0xbc);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xbd;
  file_28.m_begin = (iterator)&local_6a8;
  msg_28.m_end = pvVar5;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_6b8,
             msg_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/33",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/33\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/33\").IsValid()" + 0x25;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6c0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_6c8,0xbd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xbe;
  file_29.m_begin = (iterator)&local_6d8;
  msg_29.m_end = pvVar5;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6e8,
             msg_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1.2.3.0/300",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/300\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/300\").IsValid()" + 0x26;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6f0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_6f8,0xbe);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xbf;
  file_30.m_begin = (iterator)&local_708;
  msg_30.m_end = pvVar5;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_718,
             msg_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8/0",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  local_e8.direct[0] = CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/0\").IsValid()";
  local_108._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/0\").IsValid()" + 0x2b;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_720 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_728,0xbf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0xc0;
  file_31.m_begin = (iterator)&local_738;
  msg_31.m_end = pvVar5;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_748,
             msg_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8/33",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  local_e8.direct[0] = CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/33\").IsValid()";
  local_108._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/33\").IsValid()" + 0x2c;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_750 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_758,0xc0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xc1;
  file_32.m_begin = (iterator)&local_768;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_778,
             msg_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8/-1",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"1:2:3:4:5:6:7:8/-1\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"1:2:3:4:5:6:7:8/-1\").IsValid()" + 0x2d;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_780 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_788,0xc1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xc2;
  file_33.m_begin = (iterator)&local_798;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_7a8,
             msg_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8/128",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  local_e8.direct[0] = CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/128\").IsValid()";
  local_108._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/128\").IsValid()" + 0x2d;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_7b8,0xc2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xc3;
  file_34.m_begin = (iterator)&local_7c8;
  msg_34.m_end = pvVar5;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_7d8,
             msg_34);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"1:2:3:4:5:6:7:8/129",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"1:2:3:4:5:6:7:8/129\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"1:2:3:4:5:6:7:8/129\").IsValid()" + 0x2e;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_7e8,0xc3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xc4;
  file_35.m_begin = (iterator)&local_7f8;
  msg_35.m_end = pvVar5;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_808,
             msg_35);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"fuzzy",(allocator<char> *)local_128);
  LookupSubNet(&subnet,(string *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!LookupSubNet(\"fuzzy\").IsValid()";
  local_108._8_8_ = (long)"!LookupSubNet(\"fuzzy\").IsValid()" + 0x20;
  tor_addr.m_addr._union.direct[8] = '\0';
  tor_addr.m_addr._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  tor_addr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_810 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  tor_addr._24_8_ = (lazy_ostream *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)&tor_addr,1,0,WARN,_cVar9,
             (size_t)&local_818,0xc4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  std::__cxx11::string::~string((string *)local_c8);
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xc7;
  file_36.m_begin = (iterator)&local_828;
  msg_36.m_end = pvVar5;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_838,
             msg_36);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"127.0.0.1",(allocator<char> *)&local_a90);
  ResolveIP((CNetAddr *)local_c8,(string *)&tor_addr);
  CSubNet::CSubNet(&subnet,(CNetAddr *)local_c8);
  bVar3 = CSubNet::IsValid(&subnet);
  local_108.direct[0] = bVar3;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_128._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).IsValid()";
  local_128._8_8_ = "";
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
  local_e8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_840 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_d8._8_8_ = (allocator<char> *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_108,(lazy_ostream *)&local_e8,1,0,WARN,_cVar9,
             (size_t)&local_848,199);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xc8;
  file_37.m_begin = (iterator)&local_858;
  msg_37.m_end = pvVar5;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_868,
             msg_37);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"127.0.0.1",(allocator<char> *)&local_aa0);
  ResolveIP((CNetAddr *)local_c8,(string *)&tor_addr);
  CSubNet::CSubNet(&subnet,(CNetAddr *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"127.0.0.1",&local_869);
  ResolveIP((CNetAddr *)&local_e8,(string *)&local_108);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)CSubNet::Match(&subnet,(CNetAddr *)&local_e8);
  local_a90.m_message.px = (element_type *)0x0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a68._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).Match(ResolveIP(\"127.0.0.1\"))";
  local_a68.m_message.px = (element_type *)0xbc86e5;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_878 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_118._8_8_ = (allocator<char> *)&local_a68;
  local_a90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_a90,(lazy_ostream *)local_128,1,0,WARN,_cVar9,(size_t)&local_880,200);
  boost::detail::shared_count::~shared_count(&local_a90.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_890 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xc9;
  file_38.m_begin = (iterator)&local_890;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_8a0,
             msg_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"127.0.0.1",(allocator<char> *)&local_aa0);
  ResolveIP((CNetAddr *)local_c8,(string *)&tor_addr);
  CSubNet::CSubNet(&subnet,(CNetAddr *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"127.0.0.2",&local_869);
  ResolveIP((CNetAddr *)&local_e8,(string *)&local_108);
  bVar3 = CSubNet::Match(&subnet,(CNetAddr *)&local_e8);
  local_a90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_a90.m_message.px = (element_type *)0x0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a68._0_8_ = "!CSubNet(ResolveIP(\"127.0.0.1\")).Match(ResolveIP(\"127.0.0.2\"))";
  local_a68.m_message.px = (element_type *)0xbc872e;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_118._8_8_ = (allocator<char> *)&local_a68;
  boost::test_tools::tt_detail::report_assertion
            (&local_a90,(lazy_ostream *)local_128,1,0,WARN,_cVar9,(size_t)&local_8b0,0xc9);
  boost::detail::shared_count::~shared_count(&local_a90.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0xca;
  file_39.m_begin = (iterator)&local_8c0;
  msg_39.m_end = pvVar5;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_8d0,
             msg_39);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"127.0.0.1",(allocator<char> *)&local_a68);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet(&subnet,&tor_addr);
  CSubNet::ToString_abi_cxx11_((string *)local_c8,&subnet);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"127.0.0.1/32");
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).ToString() == \"127.0.0.1/32\"";
  local_a90.m_message.px = (element_type *)0xbc8778;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = &local_a90;
  local_128[0] = rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,_cVar9,
             (size_t)&local_8e0,0xca);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"1.2.3.4",(allocator<char> *)&local_e8);
  ResolveIP((CNetAddr *)local_c8,(string *)&tor_addr);
  CSubNet::CSubNet(&subnet,(CNetAddr *)local_c8,' ');
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&tor_addr);
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0xcd;
  file_40.m_begin = (iterator)&local_8f0;
  msg_40.m_end = pvVar5;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_900,
             msg_40);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_908 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_910,0xcd,1,2,pCVar6,"subnet.ToString()","1.2.3.4/32","\"1.2.3.4/32\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_108);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,'\b');
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_920 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0xcf;
  file_41.m_begin = (iterator)&local_920;
  msg_41.m_end = (iterator)pCVar6;
  msg_41.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_930,
             msg_41);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_938 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_940,0xcf,1,2,pCVar6,"subnet.ToString()","1.0.0.0/8","\"1.0.0.0/8\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_108);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,'\0');
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_950 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0xd1;
  file_42.m_begin = (iterator)&local_950;
  msg_42.m_end = (iterator)pCVar6;
  msg_42.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_960,
             msg_42);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_970 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_968 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_970,0xd1,1,2,pCVar6,"subnet.ToString()","0.0.0.0/0","\"0.0.0.0/0\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_a90);
  ResolveIP(&tor_addr,(string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"255.255.255.255",(allocator<char> *)&local_a68);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_108);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0xd4;
  file_43.m_begin = (iterator)&local_980;
  msg_43.m_end = (iterator)pCVar6;
  msg_43.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_990,
             msg_43);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_998 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_9a0,0xd4,1,2,pCVar6,"subnet.ToString()","1.2.3.4/32","\"1.2.3.4/32\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_a90);
  ResolveIP(&tor_addr,(string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"255.0.0.0",(allocator<char> *)&local_a68);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_108);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_9b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0xd6;
  file_44.m_begin = (iterator)&local_9b0;
  msg_44.m_end = (iterator)pCVar6;
  msg_44.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_9c0,
             msg_44);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9c8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_9d0,0xd6,1,2,pCVar6,"subnet.ToString()","1.0.0.0/8","\"1.0.0.0/8\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_a90);
  ResolveIP(&tor_addr,(string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"0.0.0.0",(allocator<char> *)&local_a68);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_108);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_9e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0xd8;
  file_45.m_begin = (iterator)&local_9e0;
  msg_45.m_end = (iterator)pCVar6;
  msg_45.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_9f0,
             msg_45);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9f8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,&subnet);
  pcVar8 = "0.0.0.0/0";
  pvVar4 = (iterator)0x2;
  pCVar6 = &tor_addr;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_a00,0xd8,1,2,pCVar6,"subnet.ToString()","0.0.0.0/0","\"0.0.0.0/0\"");
  std::__cxx11::string::~string((string *)&tor_addr);
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0xda;
  file_46.m_begin = (iterator)&local_a10;
  msg_46.m_end = (iterator)pCVar6;
  msg_46.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_a20,
             msg_46);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8",(allocator<char> *)&local_a68);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr);
  local_128[0] = (class_property<bool>)CSubNet::IsValid((CSubNet *)local_c8);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).IsValid()";
  local_a90.m_message.px = (element_type *)0xbc87d7;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a28 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (allocator<char> *)&local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_a30,0xda);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_a40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0xdb;
  file_47.m_begin = (iterator)&local_a40;
  msg_47.m_end = pvVar5;
  msg_47.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_a50,
             msg_47);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8",&local_869);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"1:2:3:4:5:6:7:8",&local_a69);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)CSubNet::Match((CSubNet *)local_c8,(CNetAddr *)&local_108);
  local_a68.m_message.px = (element_type *)0x0;
  local_a68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_aa0 = "CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).Match(ResolveIP(\"1:2:3:4:5:6:7:8\"))";
  local_a98 = "";
  local_a90.m_message.px = (element_type *)((ulong)local_a90.m_message.px & 0xffffffffffffff00);
  local_a90._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ab0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_aa8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_a78 = (allocator<char> *)&local_aa0;
  local_a68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_a68,(lazy_ostream *)&local_a90,1,0,WARN,(check_type)pcVar8,(size_t)&local_ab0,
             0xdb);
  boost::detail::shared_count::~shared_count(&local_a68.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0xdc;
  file_48.m_begin = (iterator)&local_ac0;
  msg_48.m_end = pvVar5;
  msg_48.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_ad0,
             msg_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8",&local_869);
  ResolveIP(&tor_addr,(string *)&local_e8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"1:2:3:4:5:6:7:9",&local_a69);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  bVar3 = CSubNet::Match((CSubNet *)local_c8,(CNetAddr *)&local_108);
  local_a68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_a68.m_message.px = (element_type *)0x0;
  local_a68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_aa0 = "!CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).Match(ResolveIP(\"1:2:3:4:5:6:7:9\"))";
  local_a98 = "";
  local_a90.m_message.px = (element_type *)((ulong)local_a90.m_message.px & 0xffffffffffffff00);
  local_a90._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ae0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ad8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_a78 = (allocator<char> *)&local_aa0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a68,(lazy_ostream *)&local_a90,1,0,WARN,(check_type)pcVar8,(size_t)&local_ae0,
             0xdc);
  boost::detail::shared_count::~shared_count(&local_a68.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_af0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0xdd;
  file_49.m_begin = (iterator)&local_af0;
  msg_49.m_end = pvVar5;
  msg_49.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_b00,
             msg_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"1:2:3:4:5:6:7:8",(allocator<char> *)&local_aa0);
  ResolveIP((CNetAddr *)&local_e8,(string *)&local_108);
  CSubNet::CSubNet((CSubNet *)local_c8,(CNetAddr *)&local_e8);
  CSubNet::ToString_abi_cxx11_((string *)&tor_addr,(CSubNet *)local_c8);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tor_addr,"1:2:3:4:5:6:7:8/128");
  local_a90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_a90.m_message.px = (element_type *)0x0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a68._0_8_ = "CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).ToString() == \"1:2:3:4:5:6:7:8/128\"";
  local_a68.m_message.px = (element_type *)0xbc88b6;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b08 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_118._8_8_ = &local_a68;
  boost::test_tools::tt_detail::report_assertion
            (&local_a90,(lazy_ostream *)local_128,1,0,WARN,(check_type)pcVar8,(size_t)&local_b10,
             0xdd);
  boost::detail::shared_count::~shared_count(&local_a90.m_message.pn);
  std::__cxx11::string::~string((string *)&tor_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  local_b20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0xdf;
  file_50.m_begin = (iterator)&local_b20;
  msg_50.m_end = pvVar5;
  msg_50.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_b30,
             msg_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"1.1.1.1",&local_869);
  ResolveIP(&tor_addr,(string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"ffff::",&local_a69);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_108);
  bVar3 = CSubNet::IsValid((CSubNet *)local_c8);
  local_a68.m_message.px = (element_type *)0x0;
  local_a68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_aa0 = "!CSubNet(ResolveIP(\"1.1.1.1\"), ResolveIP(\"ffff::\")).IsValid()";
  local_a98 = "";
  local_a90.m_message.px = (element_type *)((ulong)local_a90.m_message.px & 0xffffffffffffff00);
  local_a90._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_b40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b38 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_a78 = (allocator<char> *)&local_aa0;
  local_a68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_a68,(lazy_ostream *)&local_a90,1,0,WARN,(check_type)pcVar8,(size_t)&local_b40,
             0xdf);
  boost::detail::shared_count::~shared_count(&local_a68.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  local_b50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0xe0;
  file_51.m_begin = (iterator)&local_b50;
  msg_51.m_end = pvVar5;
  msg_51.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_b60,
             msg_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"::1",&local_869);
  ResolveIP(&tor_addr,(string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"255.0.0.0",&local_a69);
  ResolveIP((CNetAddr *)&local_108,(string *)local_128);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_108);
  bVar3 = CSubNet::IsValid((CSubNet *)local_c8);
  local_a68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_a68.m_message.px = (element_type *)0x0;
  local_a68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_aa0 = "!CSubNet(ResolveIP(\"::1\"), ResolveIP(\"255.0.0.0\")).IsValid()";
  local_a98 = "";
  local_a90.m_message.px = (element_type *)((ulong)local_a90.m_message.px & 0xffffffffffffff00);
  local_a90._0_8_ = &PTR__lazy_ostream_011481f0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_b70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b68 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_a78 = (allocator<char> *)&local_aa0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a68,(lazy_ostream *)&local_a90,1,0,WARN,(check_type)pcVar8,(size_t)&local_b70,
             0xe0);
  boost::detail::shared_count::~shared_count(&local_a68.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",
             (allocator<char> *)&local_e8);
  ResolveIP(&tor_addr,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  local_b80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b78 = "";
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0xe8;
  file_52.m_begin = (iterator)&local_b80;
  msg_52.m_end = pvVar5;
  msg_52.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_b90,
             msg_52);
  rVar2.super_class_property<bool>.value = (class_property<bool>)CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "subnet.IsValid()";
  local_108._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_ba0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b98 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_c8._24_8_ = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108;
  local_e8.direct[0] = (char)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_ba0,0xe8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  local_bb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ba8 = "";
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0xe9;
  file_53.m_begin = (iterator)&local_bb0;
  msg_53.m_end = pvVar5;
  msg_53.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_bc0,
             msg_53);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_bd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bc8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  __return_storage_ptr__ = (string *)&local_108;
  CNetAddr::ToStringAddr_abi_cxx11_(__return_storage_ptr__,&tor_addr);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_c8,&local_bd0,0xe9,1,2,pppuVar7,"subnet.ToString()",__return_storage_ptr__,
             "tor_addr.ToStringAddr()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  local_be0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0xea;
  file_54.m_begin = (iterator)&local_be0;
  msg_54.m_end = (iterator)pppuVar7;
  msg_54.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_bf0,
             msg_54);
  local_e8.direct[0] = CSubNet::Match(&subnet,&tor_addr);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "subnet.Match(tor_addr)";
  local_108._8_8_ = (long)"subnet.Match(tor_addr)" + 0x16;
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bf8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_c8._24_8_ = (string *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_c00,0xea);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  local_c10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0xec;
  file_55.m_begin = (iterator)&local_c10;
  msg_55.m_end = pvVar5;
  msg_55.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_c20,
             msg_55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion",
             (allocator<char> *)&local_a68);
  ResolveIP((CNetAddr *)local_c8,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,(CNetAddr *)local_c8);
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ =
       "!subnet.Match(ResolveIP(\"kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion\"))"
  ;
  local_a90.m_message.px = (element_type *)0xbc89ca;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c28 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (lazy_ostream *)&local_a90;
  local_128[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_c30,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_c40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0xed;
  file_56.m_begin = (iterator)&local_c40;
  msg_56.m_end = pvVar5;
  msg_56.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_c50,
             msg_56);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4",(allocator<char> *)&local_a68);
  ResolveIP((CNetAddr *)local_c8,(string *)&local_e8);
  bVar3 = CSubNet::Match(&subnet,(CNetAddr *)local_c8);
  local_128[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_128._8_8_ = (element_type *)0x0;
  aStack_118._M_allocated_capacity = 0;
  local_a90._0_8_ = "!subnet.Match(ResolveIP(\"1.2.3.4\"))";
  local_a90.m_message.px = (element_type *)0xbc89ee;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c58 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_f8._8_8_ = (lazy_ostream *)&local_a90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_128,(lazy_ostream *)&local_108,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_c60,0xed);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0xef;
  file_57.m_begin = (iterator)&local_c70;
  msg_57.m_end = pvVar5;
  msg_57.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_c80,
             msg_57);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,200);
  bVar3 = CSubNet::IsValid((CSubNet *)local_c8);
  local_108.direct[0] = !bVar3;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_128._0_8_ = "!CSubNet(tor_addr, 200).IsValid()";
  local_128._8_8_ = "";
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
  local_e8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  aStack_d8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c88 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_d8._8_8_ = (assertion_result *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_108,(lazy_ostream *)&local_e8,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_c90,0xef);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  local_ca0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0xf0;
  file_58.m_begin = (iterator)&local_ca0;
  msg_58.m_end = pvVar5;
  msg_58.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_cb0,
             msg_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"255.0.0.0",(allocator<char> *)&local_aa0);
  ResolveIP((CNetAddr *)&local_e8,(string *)&local_108);
  CSubNet::CSubNet((CSubNet *)local_c8,&tor_addr,(CNetAddr *)&local_e8);
  bVar3 = CSubNet::IsValid((CSubNet *)local_c8);
  local_a90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_a90.m_message.px = (element_type *)0x0;
  local_a90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a68._0_8_ = "!CSubNet(tor_addr, ResolveIP(\"255.0.0.0\")).IsValid()";
  local_a68.m_message.px = (element_type *)0xbc8a45;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_cc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_cb8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  aStack_118._8_8_ = (allocator<char> *)&local_a68;
  boost::test_tools::tt_detail::report_assertion
            (&local_a90,(lazy_ostream *)local_128,1,0,WARN,(check_type)__return_storage_ptr__,
             (size_t)&local_cc0,0xf0);
  boost::detail::shared_count::~shared_count(&local_a90.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.255",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_cd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_cc8 = "";
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0xf3;
  file_59.m_begin = (iterator)&local_cd0;
  msg_59.m_end = pvVar5;
  msg_59.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_ce0,
             msg_59);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_cf0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ce8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_cf0,0xf3,1,2,pppuVar7,"subnet.ToString()","1.2.3.4/32","\"1.2.3.4/32\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.254",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_d00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_cf8 = "";
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0xf5;
  file_60.m_begin = (iterator)&local_d00;
  msg_60.m_end = (iterator)pppuVar7;
  msg_60.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_d10,
             msg_60);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d18 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_d20,0xf5,1,2,pppuVar7,"subnet.ToString()","1.2.3.4/31","\"1.2.3.4/31\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.252",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_d30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0xf7;
  file_61.m_begin = (iterator)&local_d30;
  msg_61.m_end = (iterator)pppuVar7;
  msg_61.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_d40,
             msg_61);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d48 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_d50,0xf7,1,2,pppuVar7,"subnet.ToString()","1.2.3.4/30","\"1.2.3.4/30\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.248",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_d60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d58 = "";
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0xf9;
  file_62.m_begin = (iterator)&local_d60;
  msg_62.m_end = (iterator)pppuVar7;
  msg_62.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_d70,
             msg_62);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d78 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_d80,0xf9,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/29","\"1.2.3.0/29\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.240",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_d90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d88 = "";
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0xfb;
  file_63.m_begin = (iterator)&local_d90;
  msg_63.m_end = (iterator)pppuVar7;
  msg_63.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_da0,
             msg_63);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_db0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_da8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_db0,0xfb,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/28","\"1.2.3.0/28\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.224",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_dc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_db8 = "";
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0xfd;
  file_64.m_begin = (iterator)&local_dc0;
  msg_64.m_end = (iterator)pppuVar7;
  msg_64.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_dd0,
             msg_64);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_de0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_dd8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_de0,0xfd,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/27","\"1.2.3.0/27\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.192",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_df0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_de8 = "";
  local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0xff;
  file_65.m_begin = (iterator)&local_df0;
  msg_65.m_end = (iterator)pppuVar7;
  msg_65.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_e00,
             msg_65);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e08 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_e10,0xff,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/26","\"1.2.3.0/26\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.128",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_e20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e18 = "";
  local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x101;
  file_66.m_begin = (iterator)&local_e20;
  msg_66.m_end = (iterator)pppuVar7;
  msg_66.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_e30,
             msg_66);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e38 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_e40,0x101,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/25",
             "\"1.2.3.0/25\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.255.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_e50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e48 = "";
  local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_67.m_end = (iterator)0x103;
  file_67.m_begin = (iterator)&local_e50;
  msg_67.m_end = (iterator)pppuVar7;
  msg_67.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_e60,
             msg_67);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e68 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_e70,0x103,1,2,pppuVar7,"subnet.ToString()","1.2.3.0/24",
             "\"1.2.3.0/24\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.254.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_e80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e78 = "";
  local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e88 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x105;
  file_68.m_begin = (iterator)&local_e80;
  msg_68.m_end = (iterator)pppuVar7;
  msg_68.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_e90,
             msg_68);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ea0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e98 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_ea0,0x105,1,2,pppuVar7,"subnet.ToString()","1.2.2.0/23",
             "\"1.2.2.0/23\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.252.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_eb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ea8 = "";
  local_ec0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_eb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_69.m_end = (iterator)0x107;
  file_69.m_begin = (iterator)&local_eb0;
  msg_69.m_end = (iterator)pppuVar7;
  msg_69.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_ec0,
             msg_69);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ed0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ec8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_ed0,0x107,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/22",
             "\"1.2.0.0/22\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.248.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_ee0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ed8 = "";
  local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_70.m_end = (iterator)0x109;
  file_70.m_begin = (iterator)&local_ee0;
  msg_70.m_end = (iterator)pppuVar7;
  msg_70.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_ef0,
             msg_70);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ef8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_f00,0x109,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/21",
             "\"1.2.0.0/21\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.240.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_f10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f08 = "";
  local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_71.m_end = (iterator)0x10b;
  file_71.m_begin = (iterator)&local_f10;
  msg_71.m_end = (iterator)pppuVar7;
  msg_71.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_f20,
             msg_71);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f28 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_f30,0x10b,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/20",
             "\"1.2.0.0/20\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.224.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_f40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f38 = "";
  local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_72.m_end = (iterator)0x10d;
  file_72.m_begin = (iterator)&local_f40;
  msg_72.m_end = (iterator)pppuVar7;
  msg_72.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_f50,
             msg_72);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f58 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_f60,0x10d,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/19",
             "\"1.2.0.0/19\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.192.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_f70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f68 = "";
  local_f80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_73.m_end = (iterator)0x10f;
  file_73.m_begin = (iterator)&local_f70;
  msg_73.m_end = (iterator)pppuVar7;
  msg_73.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_f80,
             msg_73);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f88 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_f90,0x10f,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/18",
             "\"1.2.0.0/18\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.128.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_fa0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f98 = "";
  local_fb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_74.m_end = (iterator)0x111;
  file_74.m_begin = (iterator)&local_fa0;
  msg_74.m_end = (iterator)pppuVar7;
  msg_74.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_fb0,
             msg_74);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_fc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fb8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_fc0,0x111,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/17",
             "\"1.2.0.0/17\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_fd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fc8 = "";
  local_fe0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_75.m_end = (iterator)0x113;
  file_75.m_begin = (iterator)&local_fd0;
  msg_75.m_end = (iterator)pppuVar7;
  msg_75.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_fe0,
             msg_75);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ff0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fe8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_ff0,0x113,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/16",
             "\"1.2.0.0/16\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.254.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1000 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ff8 = "";
  local_1010 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
  file_76.m_end = (iterator)0x115;
  file_76.m_begin = (iterator)&local_1000;
  msg_76.m_end = (iterator)pppuVar7;
  msg_76.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_1010,
             msg_76);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1020 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1018 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_1020,0x115,1,2,pppuVar7,"subnet.ToString()","1.2.0.0/15",
             "\"1.2.0.0/15\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.252.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1030 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1028 = "";
  local_1040 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
  file_77.m_end = (iterator)0x117;
  file_77.m_begin = (iterator)&local_1030;
  msg_77.m_end = (iterator)pppuVar7;
  msg_77.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_1040,
             msg_77);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1050 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1048 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_1050,0x117,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/14",
             "\"1.0.0.0/14\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.248.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1060 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1058 = "";
  local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
  file_78.m_end = (iterator)0x119;
  file_78.m_begin = (iterator)&local_1060;
  msg_78.m_end = (iterator)pppuVar7;
  msg_78.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_1070,
             msg_78);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1080 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1078 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_1080,0x119,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/13",
             "\"1.0.0.0/13\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.240.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1090 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1088 = "";
  local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  file_79.m_end = (iterator)0x11b;
  file_79.m_begin = (iterator)&local_1090;
  msg_79.m_end = (iterator)pppuVar7;
  msg_79.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_79,(size_t)&local_10a0,
             msg_79);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_10b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10a8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_10b0,0x11b,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/12",
             "\"1.0.0.0/12\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.224.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_10c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10b8 = "";
  local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_80.m_end = (iterator)0x11d;
  file_80.m_begin = (iterator)&local_10c0;
  msg_80.m_end = (iterator)pppuVar7;
  msg_80.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_80,(size_t)&local_10d0,
             msg_80);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_10e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10d8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_10e0,0x11d,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/11",
             "\"1.0.0.0/11\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.192.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_10f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10e8 = "";
  local_1100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_81.m_end = (iterator)0x11f;
  file_81.m_begin = (iterator)&local_10f0;
  msg_81.m_end = (iterator)pppuVar7;
  msg_81.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_81,(size_t)&local_1100,
             msg_81);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1108 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_c8,&local_1110,0x11f,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/10",
             "\"1.0.0.0/10\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.128.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1118 = "";
  local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_82.m_end = (iterator)0x121;
  file_82.m_begin = (iterator)&local_1120;
  msg_82.m_end = (iterator)pppuVar7;
  msg_82.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_82,(size_t)&local_1130,
             msg_82);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1138 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1140,0x121,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/9","\"1.0.0.0/9\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1148 = "";
  local_1160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_83.m_end = (iterator)0x123;
  file_83.m_begin = (iterator)&local_1150;
  msg_83.m_end = (iterator)pppuVar7;
  msg_83.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_83,(size_t)&local_1160,
             msg_83);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1168 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1170,0x123,1,2,pppuVar7,"subnet.ToString()","1.0.0.0/8","\"1.0.0.0/8\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/254.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1178 = "";
  local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_84.m_end = (iterator)0x125;
  file_84.m_begin = (iterator)&local_1180;
  msg_84.m_end = (iterator)pppuVar7;
  msg_84.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_84,(size_t)&local_1190,
             msg_84);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_11a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1198 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_11a0,0x125,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/7","\"0.0.0.0/7\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/252.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_11b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_11a8 = "";
  local_11c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_85.m_end = (iterator)0x127;
  file_85.m_begin = (iterator)&local_11b0;
  msg_85.m_end = (iterator)pppuVar7;
  msg_85.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_85,(size_t)&local_11c0,
             msg_85);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_11d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_11c8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_11d0,0x127,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/6","\"0.0.0.0/6\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/248.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_11e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_11d8 = "";
  local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_86.m_end = (iterator)0x129;
  file_86.m_begin = (iterator)&local_11e0;
  msg_86.m_end = (iterator)pppuVar7;
  msg_86.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_86,(size_t)&local_11f0,
             msg_86);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_11f8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1200,0x129,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/5","\"0.0.0.0/5\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/240.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1208 = "";
  local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_87.m_end = (iterator)0x12b;
  file_87.m_begin = (iterator)&local_1210;
  msg_87.m_end = (iterator)pppuVar7;
  msg_87.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_87,(size_t)&local_1220,
             msg_87);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1228 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1230,299,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/4","\"0.0.0.0/4\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/224.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1238 = "";
  local_1250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_88.m_end = (iterator)0x12d;
  file_88.m_begin = (iterator)&local_1240;
  msg_88.m_end = (iterator)pppuVar7;
  msg_88.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_88,(size_t)&local_1250,
             msg_88);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1258 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1260,0x12d,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/3","\"0.0.0.0/3\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/192.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1268 = "";
  local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_89.m_end = (iterator)0x12f;
  file_89.m_begin = (iterator)&local_1270;
  msg_89.m_end = (iterator)pppuVar7;
  msg_89.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_89,(size_t)&local_1280,
             msg_89);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1288 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_1290,0x12f,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/2","\"0.0.0.0/2\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/128.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_12a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1298 = "";
  local_12b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_90.m_end = (iterator)0x131;
  file_90.m_begin = (iterator)&local_12a0;
  msg_90.m_end = (iterator)pppuVar7;
  msg_90.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_90,(size_t)&local_12b0,
             msg_90);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_12c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_12b8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_12c0,0x131,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/1","\"0.0.0.0/1\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/0.0.0.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_12d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_12c8 = "";
  local_12e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_91.m_end = (iterator)0x133;
  file_91.m_begin = (iterator)&local_12d0;
  msg_91.m_end = (iterator)pppuVar7;
  msg_91.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_91,(size_t)&local_12e0,
             msg_91);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_12e8 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (local_c8,&local_12f0,0x133,1,2,pppuVar7,"subnet.ToString()","0.0.0.0/0","\"0.0.0.0/0\""
            );
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8/ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff",
             (allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_12f8 = "";
  local_1310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_92.m_end = (iterator)0x136;
  file_92.m_begin = (iterator)&local_1300;
  msg_92.m_end = (iterator)pppuVar7;
  msg_92.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_92,(size_t)&local_1310,
             msg_92);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1318 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[20]>
            (local_c8,&local_1320,0x136,1,2,pppuVar7,"subnet.ToString()","1:2:3:4:5:6:7:8/128",
             "\"1:2:3:4:5:6:7:8/128\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8/ffff:0000:0000:0000:0000:0000:0000:0000",
             (allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1328 = "";
  local_1340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_93.m_end = (iterator)0x138;
  file_93.m_begin = (iterator)&local_1330;
  msg_93.m_end = (iterator)pppuVar7;
  msg_93.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_93,(size_t)&local_1340,
             msg_93);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1348 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_c8,&local_1350,0x138,1,2,pppuVar7,"subnet.ToString()","1::/16","\"1::/16\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8/0000:0000:0000:0000:0000:0000:0000:0000",
             (allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1358 = "";
  local_1370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_94.m_end = (iterator)0x13a;
  file_94.m_begin = (iterator)&local_1360;
  msg_94.m_end = (iterator)pppuVar7;
  msg_94.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_94,(size_t)&local_1370,
             msg_94);
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1378 = "";
  CSubNet::ToString_abi_cxx11_((string *)&local_e8,&subnet);
  pcVar8 = "::/0";
  pvVar4 = (iterator)0x2;
  pppuVar7 = (undefined ***)&local_e8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_c8,&local_1380,0x13a,1,2,pppuVar7,"subnet.ToString()","::/0","\"::/0\"");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.255.232.0",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_1390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1388 = "";
  local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_95.m_end = (iterator)0x13d;
  file_95.m_begin = (iterator)&local_1390;
  msg_95.m_end = (iterator)pppuVar7;
  msg_95.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_95,(size_t)&local_13a0,
             msg_95);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!subnet.IsValid()";
  local_108._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_13b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_13a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_c8._24_8_ = (allocator<char> *)&local_108;
  local_e8.direct[0] = !bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_13b0,0x13d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1.2.3.4/255.0.255.255",(allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_13c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_13b8 = "";
  local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_96.m_end = (iterator)0x13f;
  file_96.m_begin = (iterator)&local_13c0;
  msg_96.m_end = pvVar5;
  msg_96.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_96,(size_t)&local_13d0,
             msg_96);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!subnet.IsValid()";
  local_108._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_13e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_13d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_c8._24_8_ = (allocator<char> *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_13e0,0x13f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"1:2:3:4:5:6:7:8/ffff:ffff:ffff:fffe:ffff:ffff:ffff:ff0f",
             (allocator<char> *)&local_108);
  LookupSubNet((CSubNet *)local_c8,(string *)&local_e8);
  CSubNet::operator=(&subnet,(CSubNet *)local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_13f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_13e8 = "";
  local_1400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_97.m_end = (iterator)0x141;
  file_97.m_begin = (iterator)&local_13f0;
  msg_97.m_end = pvVar5;
  msg_97.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_97,(size_t)&local_1400,
             msg_97);
  bVar3 = CSubNet::IsValid(&subnet);
  local_e8.direct[0] = !bVar3;
  local_e8._8_8_ = (element_type *)0x0;
  aStack_d8._M_allocated_capacity = 0;
  local_108.indirect_contents.indirect = "!subnet.IsValid()";
  local_108._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1408 = "";
  local_c8._24_8_ = (allocator<char> *)&local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_1410,0x141);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_d8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_addr.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(subnet_test)
{

    BOOST_CHECK(LookupSubNet("1.2.3.0/24") == LookupSubNet("1.2.3.0/255.255.255.0"));
    BOOST_CHECK(LookupSubNet("1.2.3.0/24") != LookupSubNet("1.2.4.0/255.255.255.0"));
    BOOST_CHECK(LookupSubNet("1.2.3.0/24").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("1.2.2.0/24").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(LookupSubNet("1.2.3.4").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(LookupSubNet("1.2.3.4/32").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("1.2.3.4").Match(ResolveIP("5.6.7.8")));
    BOOST_CHECK(!LookupSubNet("1.2.3.4/32").Match(ResolveIP("5.6.7.8")));
    BOOST_CHECK(LookupSubNet("::ffff:127.0.0.1").Match(ResolveIP("127.0.0.1")));
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8").Match(ResolveIP("1:2:3:4:5:6:7:8")));
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8").Match(ResolveIP("1:2:3:4:5:6:7:9")));
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:0/112").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    BOOST_CHECK(LookupSubNet("192.168.0.1/24").Match(ResolveIP("192.168.0.2")));
    BOOST_CHECK(LookupSubNet("192.168.0.20/29").Match(ResolveIP("192.168.0.18")));
    BOOST_CHECK(LookupSubNet("1.2.2.1/24").Match(ResolveIP("1.2.2.4")));
    BOOST_CHECK(LookupSubNet("1.2.2.110/31").Match(ResolveIP("1.2.2.111")));
    BOOST_CHECK(LookupSubNet("1.2.2.20/26").Match(ResolveIP("1.2.2.63")));
    // All-Matching IPv6 Matches arbitrary IPv6
    BOOST_CHECK(LookupSubNet("::/0").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    // But not `::` or `0.0.0.0` because they are considered invalid addresses
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("::")));
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("0.0.0.0")));
    // Addresses from one network (IPv4) don't belong to subnets of another network (IPv6)
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("1.2.3.4")));
    // All-Matching IPv4 does not Match IPv6
    BOOST_CHECK(!LookupSubNet("0.0.0.0/0").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    // Invalid subnets Match nothing (not even invalid addresses)
    BOOST_CHECK(!CSubNet().Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("").Match(ResolveIP("4.5.6.7")));
    BOOST_CHECK(!LookupSubNet("bloop").Match(ResolveIP("0.0.0.0")));
    BOOST_CHECK(!LookupSubNet("bloop").Match(ResolveIP("hab")));
    // Check valid/invalid
    BOOST_CHECK(LookupSubNet("1.2.3.0/0").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/-1").IsValid());
    BOOST_CHECK(LookupSubNet("1.2.3.0/32").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/33").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/300").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/0").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/33").IsValid());
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8/-1").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/128").IsValid());
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8/129").IsValid());
    BOOST_CHECK(!LookupSubNet("fuzzy").IsValid());

    //CNetAddr constructor test
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).IsValid());
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).Match(ResolveIP("127.0.0.1")));
    BOOST_CHECK(!CSubNet(ResolveIP("127.0.0.1")).Match(ResolveIP("127.0.0.2")));
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).ToString() == "127.0.0.1/32");

    CSubNet subnet = CSubNet(ResolveIP("1.2.3.4"), 32);
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = CSubNet(ResolveIP("1.2.3.4"), 8);
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = CSubNet(ResolveIP("1.2.3.4"), 0);
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("255.255.255.255"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("255.0.0.0"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("0.0.0.0"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).IsValid());
    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).Match(ResolveIP("1:2:3:4:5:6:7:8")));
    BOOST_CHECK(!CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).Match(ResolveIP("1:2:3:4:5:6:7:9")));
    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).ToString() == "1:2:3:4:5:6:7:8/128");
    // IPv4 address with IPv6 netmask or the other way around.
    BOOST_CHECK(!CSubNet(ResolveIP("1.1.1.1"), ResolveIP("ffff::")).IsValid());
    BOOST_CHECK(!CSubNet(ResolveIP("::1"), ResolveIP("255.0.0.0")).IsValid());

    // Create Non-IP subnets.

    const CNetAddr tor_addr{
        ResolveIP("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion")};

    subnet = CSubNet(tor_addr);
    BOOST_CHECK(subnet.IsValid());
    BOOST_CHECK_EQUAL(subnet.ToString(), tor_addr.ToStringAddr());
    BOOST_CHECK(subnet.Match(tor_addr));
    BOOST_CHECK(
        !subnet.Match(ResolveIP("kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion")));
    BOOST_CHECK(!subnet.Match(ResolveIP("1.2.3.4")));

    BOOST_CHECK(!CSubNet(tor_addr, 200).IsValid());
    BOOST_CHECK(!CSubNet(tor_addr, ResolveIP("255.0.0.0")).IsValid());

    subnet = LookupSubNet("1.2.3.4/255.255.255.255");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = LookupSubNet("1.2.3.4/255.255.255.254");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/31");
    subnet = LookupSubNet("1.2.3.4/255.255.255.252");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/30");
    subnet = LookupSubNet("1.2.3.4/255.255.255.248");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/29");
    subnet = LookupSubNet("1.2.3.4/255.255.255.240");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/28");
    subnet = LookupSubNet("1.2.3.4/255.255.255.224");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/27");
    subnet = LookupSubNet("1.2.3.4/255.255.255.192");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/26");
    subnet = LookupSubNet("1.2.3.4/255.255.255.128");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/25");
    subnet = LookupSubNet("1.2.3.4/255.255.255.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/24");
    subnet = LookupSubNet("1.2.3.4/255.255.254.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.2.0/23");
    subnet = LookupSubNet("1.2.3.4/255.255.252.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/22");
    subnet = LookupSubNet("1.2.3.4/255.255.248.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/21");
    subnet = LookupSubNet("1.2.3.4/255.255.240.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/20");
    subnet = LookupSubNet("1.2.3.4/255.255.224.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/19");
    subnet = LookupSubNet("1.2.3.4/255.255.192.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/18");
    subnet = LookupSubNet("1.2.3.4/255.255.128.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/17");
    subnet = LookupSubNet("1.2.3.4/255.255.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/16");
    subnet = LookupSubNet("1.2.3.4/255.254.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/15");
    subnet = LookupSubNet("1.2.3.4/255.252.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/14");
    subnet = LookupSubNet("1.2.3.4/255.248.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/13");
    subnet = LookupSubNet("1.2.3.4/255.240.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/12");
    subnet = LookupSubNet("1.2.3.4/255.224.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/11");
    subnet = LookupSubNet("1.2.3.4/255.192.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/10");
    subnet = LookupSubNet("1.2.3.4/255.128.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/9");
    subnet = LookupSubNet("1.2.3.4/255.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = LookupSubNet("1.2.3.4/254.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/7");
    subnet = LookupSubNet("1.2.3.4/252.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/6");
    subnet = LookupSubNet("1.2.3.4/248.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/5");
    subnet = LookupSubNet("1.2.3.4/240.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/4");
    subnet = LookupSubNet("1.2.3.4/224.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/3");
    subnet = LookupSubNet("1.2.3.4/192.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/2");
    subnet = LookupSubNet("1.2.3.4/128.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/1");
    subnet = LookupSubNet("1.2.3.4/0.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1:2:3:4:5:6:7:8/128");
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:0000:0000:0000:0000:0000:0000:0000");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1::/16");
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/0000:0000:0000:0000:0000:0000:0000:0000");
    BOOST_CHECK_EQUAL(subnet.ToString(), "::/0");
    // Invalid netmasks (with 1-bits after 0-bits)
    subnet = LookupSubNet("1.2.3.4/255.255.232.0");
    BOOST_CHECK(!subnet.IsValid());
    subnet = LookupSubNet("1.2.3.4/255.0.255.255");
    BOOST_CHECK(!subnet.IsValid());
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:ffff:ffff:fffe:ffff:ffff:ffff:ff0f");
    BOOST_CHECK(!subnet.IsValid());
}